

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_NbGet64(int g_a,int64_t *lo,int64_t *hi,void *buf,int64_t *ld,ga_nbhdl_t *nbhandle)

{
  long in_RDX;
  long in_RSI;
  int in_EDI;
  long in_R8;
  int i_2;
  int i_1;
  int i;
  Integer _ga_work [7];
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  Integer ndim;
  Integer a;
  int local_104;
  int local_100;
  int local_fc;
  Integer *in_stack_ffffffffffffff08;
  Integer *in_stack_ffffffffffffff10;
  void *in_stack_ffffffffffffff18;
  Integer *in_stack_ffffffffffffff20;
  Integer *in_stack_ffffffffffffff28;
  Integer in_stack_ffffffffffffff30;
  long local_b8 [8];
  long local_78 [7];
  long local_40;
  long local_38;
  long local_28;
  long local_18;
  long local_10;
  
  local_38 = (long)in_EDI;
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_40 = pnga_ndim((Integer)hi);
  for (local_fc = 0; local_fc < local_40; local_fc = local_fc + 1) {
    local_78[(local_40 - local_fc) + -1] = *(long *)(local_10 + (long)local_fc * 8) + 1;
  }
  for (local_100 = 0; local_100 < local_40; local_100 = local_100 + 1) {
    local_b8[(local_40 - local_100) + -1] = *(long *)(local_18 + (long)local_100 * 8) + 1;
  }
  for (local_104 = 0; (long)local_104 < local_40 + -1; local_104 = local_104 + 1) {
    *(undefined8 *)(&stack0xffffffffffffff08 + ((local_40 - local_104) + -2) * 8) =
         *(undefined8 *)(local_28 + (long)local_104 * 8);
  }
  pnga_nbget(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  return;
}

Assistant:

void NGA_NbGet64(int g_a, int64_t lo[], int64_t hi[], void* buf, int64_t ld[],
               ga_nbhdl_t* nbhandle)
{
    Integer a=(Integer)g_a;
    Integer ndim = wnga_ndim(a);
    Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];
    Integer _ga_work[MAXDIM];
    COPYINDEX_C2F(lo,_ga_lo, ndim);
    COPYINDEX_C2F(hi,_ga_hi, ndim);
    COPYC2F(ld,_ga_work, ndim-1);
    wnga_nbget(a, _ga_lo, _ga_hi, buf, _ga_work,(Integer *)nbhandle);
}